

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  Chapter *pCVar1;
  int iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ulong *puVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  Chapter *pCVar10;
  
  iVar2 = this->chapters_size_;
  bVar4 = true;
  if (iVar2 <= this->chapters_count_) {
    iVar7 = 1;
    if (iVar2 != 0) {
      iVar7 = iVar2 * 2;
    }
    uVar9 = (ulong)iVar7;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
      uVar6 = SUB168(auVar3 * ZEXT816(0x30),0) | 8;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    if (puVar5 == (ulong *)0x0) {
      bVar4 = false;
    }
    else {
      *puVar5 = uVar9;
      pCVar1 = (Chapter *)(puVar5 + 1);
      lVar8 = 0;
      pCVar10 = pCVar1;
      do {
        Chapter::Chapter(pCVar10);
        lVar8 = lVar8 + -0x30;
        pCVar10 = pCVar10 + 1;
      } while (uVar9 * -0x30 - lVar8 != 0);
      pCVar10 = this->chapters_;
      uVar9 = 0;
      uVar6 = (ulong)(uint)this->chapters_count_;
      if (this->chapters_count_ < 1) {
        uVar6 = uVar9;
      }
      for (; uVar6 * 0x30 - uVar9 != 0; uVar9 = uVar9 + 0x30) {
        Chapter::ShallowCopy
                  ((Chapter *)((long)&pCVar10->id_ + uVar9),(Chapter *)((long)&pCVar1->id_ + uVar9))
        ;
      }
      if (pCVar10 != (Chapter *)0x0) {
        if (*(long *)&pCVar10[-1].displays_size_ != 0) {
          lVar8 = *(long *)&pCVar10[-1].displays_size_ * 0x30;
          do {
            Chapter::~Chapter((Chapter *)((long)&pCVar10[-1].id_ + lVar8));
            lVar8 = lVar8 + -0x30;
          } while (lVar8 != 0);
        }
        operator_delete__(&pCVar10[-1].displays_size_);
      }
      this->chapters_ = pCVar1;
      this->chapters_size_ = iVar7;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}